

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O3

void __thiscall polyscope::SurfaceMesh::computeVertexNormals(SurfaceMesh *this)

{
  ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *this_00;
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 uVar5;
  uint uVar8;
  uint uVar9;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *pvVar10;
  pointer pvVar11;
  pointer pvVar12;
  float fVar13;
  size_t sVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  undefined1 auVar22 [16];
  
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ensureHostBufferPopulated
            (&this->faceNormals);
  render::ManagedBuffer<float>::ensureHostBufferPopulated(&this->faceAreas);
  pvVar10 = (this->vertexNormals).data;
  this_00 = &this->vertexPositions;
  sVar14 = render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::size(this_00);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::resize(pvVar10,sVar14);
  pvVar10 = (this->vertexNormals).data;
  pvVar11 = (pvVar10->
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pvVar12 = (pvVar10->
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar11 != pvVar12) {
    memset(pvVar11,0,((ulong)((long)pvVar12 + (-0xc - (long)pvVar11)) / 0xc) * 0xc + 0xc);
  }
  lVar16 = *(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).field_0x430;
  lVar18 = *(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).field_0x428;
  if (lVar16 - lVar18 != 4) {
    uVar15 = 0;
    do {
      uVar8 = *(uint *)(lVar18 + uVar15 * 4);
      uVar17 = (ulong)uVar8;
      uVar9 = *(uint *)(lVar18 + 4 + uVar15 * 4);
      if (uVar9 != uVar8) {
        do {
          pvVar12 = (((this->faceNormals).data)->
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          uVar8 = *(uint *)(*(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).
                                      field_0x440 + uVar17 * 4);
          uVar17 = uVar17 + 1;
          fVar1 = (((this->faceAreas).data)->super__Vector_base<float,_std::allocator<float>_>).
                  _M_impl.super__Vector_impl_data._M_start[uVar15];
          pvVar11 = pvVar12 + uVar15;
          uVar3 = pvVar11->field_0;
          uVar6 = pvVar11->field_1;
          pvVar11 = (((this->vertexNormals).data)->
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          fVar2 = pvVar12[uVar15].field_2.z;
          uVar4 = pvVar11[uVar8].field_0;
          uVar7 = pvVar11[uVar8].field_1;
          auVar19._0_4_ = fVar1 * (float)uVar3 + (float)uVar4;
          auVar19._4_4_ = fVar1 * (float)uVar6 + (float)uVar7;
          auVar19._8_4_ = fVar1 * 0.0 + 0.0;
          auVar19._12_4_ = fVar1 * 0.0 + 0.0;
          uVar5 = vmovlps_avx(auVar19);
          pvVar11[uVar8].field_0 =
               (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar5;
          pvVar11[uVar8].field_1 =
               (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
               (int)((ulong)uVar5 >> 0x20);
          pvVar11[uVar8].field_2.z = fVar1 * fVar2 + pvVar11[uVar8].field_2.z;
        } while (uVar9 != uVar17);
        lVar18 = *(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).field_0x428;
        lVar16 = *(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).field_0x430;
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < (lVar16 - lVar18 >> 2) - 1U);
  }
  sVar14 = render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::size(this_00);
  if (sVar14 != 0) {
    lVar18 = 8;
    uVar15 = 0;
    do {
      uVar15 = uVar15 + 1;
      pvVar11 = (((this->vertexNormals).data)->
                super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar5 = *(undefined8 *)((long)pvVar11 + lVar18 + -8);
      fVar1 = *(float *)((long)&pvVar11->field_0 + lVar18);
      fVar2 = (float)uVar5;
      auVar22._0_4_ = fVar2 * fVar2;
      fVar13 = (float)((ulong)uVar5 >> 0x20);
      auVar22._4_4_ = fVar13 * fVar13;
      auVar22._8_8_ = 0;
      auVar19 = vhaddps_avx(auVar22,auVar22);
      auVar19 = ZEXT416((uint)(auVar19._0_4_ + fVar1 * fVar1));
      auVar19 = vsqrtss_avx(auVar19,auVar19);
      fVar21 = 1.0 / auVar19._0_4_;
      auVar20._0_4_ = fVar2 * fVar21;
      auVar20._4_4_ = fVar13 * fVar21;
      auVar20._8_4_ = fVar21 * 0.0;
      auVar20._12_4_ = fVar21 * 0.0;
      uVar5 = vmovlps_avx(auVar20);
      *(undefined8 *)((long)pvVar11 + lVar18 + -8) = uVar5;
      *(float *)((long)&pvVar11->field_0 + lVar18) = fVar1 * fVar21;
      sVar14 = render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::size(this_00);
      lVar18 = lVar18 + 0xc;
    } while (uVar15 < sVar14);
  }
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::markHostBufferUpdated
            (&this->vertexNormals);
  return;
}

Assistant:

void SurfaceMesh::computeVertexNormals() {

  faceNormals.ensureHostBufferPopulated();
  faceAreas.ensureHostBufferPopulated();

  vertexNormals.data.resize(nVertices());

  const glm::vec3 zero{0., 0., 0.};

  std::fill(vertexNormals.data.begin(), vertexNormals.data.end(), zero);

  // Accumulate quantities from each face
  for (size_t iF = 0; iF < nFaces(); iF++) {
    size_t start = faceIndsStart[iF];
    size_t D = faceIndsStart[iF + 1] - start;
    for (size_t j = 0; j < D; j++) {
      size_t iV = faceIndsEntries[start + j];
      vertexNormals.data[iV] += faceNormals.data[iF] * static_cast<float>(faceAreas.data[iF]);
    }
  }

  // Normalize
  for (size_t iV = 0; iV < nVertices(); iV++) {
    vertexNormals.data[iV] = glm::normalize(vertexNormals.data[iV]);
  }

  vertexNormals.markHostBufferUpdated();
}